

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall
QColumnView::currentChanged(QColumnView *this,QModelIndex *current,QModelIndex *previous)

{
  QColumnViewPrivate *this_00;
  char cVar1;
  QAbstractItemModel *pQVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined8 local_78;
  QModelIndex *pQStack_70;
  QAbstractItemModel *local_68;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((current->r < 0) || (current->c < 0)) || ((current->m).ptr == (QAbstractItemModel *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QAbstractItemView::currentChanged((QAbstractItemView *)this,current,previous);
      return;
    }
  }
  else {
    this_00 = *(QColumnViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    local_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (current->m).ptr;
    if (pQVar2 == (QAbstractItemModel *)0x0) {
      local_78 = (undefined1 *)0xffffffffffffffff;
      pQStack_70 = (QModelIndex *)0x0;
      local_68 = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x68))(&local_78,pQVar2,current);
    }
    pQVar2 = (previous->m).ptr;
    if (pQVar2 == (QAbstractItemModel *)0x0) {
      local_58.r = -1;
      local_58.c = -1;
      local_58.i = 0;
      local_58.m.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x68))(&local_58,pQVar2,previous);
    }
    if ((int)local_78 == local_58.r) {
      if (((local_78._4_4_ == local_58.c) && (pQStack_70 == (QModelIndex *)local_58.i)) &&
         (local_68 == local_58.m.ptr)) {
        pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
        cVar1 = (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,current);
        if (cVar1 != '\0') {
          pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
          cVar1 = (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,previous);
          if ((cVar1 != '\0') && ((this_00->columns).d.size != 0)) {
            uVar3 = 0;
            do {
              QAbstractItemView::rootIndex
                        (&local_58,(QAbstractItemView *)(this_00->columns).d.ptr[uVar3]);
              if ((int)local_78 == local_58.r) {
                if (((local_78._4_4_ == local_58.c) && (pQStack_70 == (QModelIndex *)local_58.i)) &&
                   (local_68 == local_58.m.ptr)) {
                  if ((ulong)((int)uVar3 + 1) < (ulong)(this_00->columns).d.size) goto LAB_0056db9b;
                  break;
                }
              }
              uVar3 = uVar3 + 1;
            } while (uVar3 < (ulong)(this_00->columns).d.size);
          }
        }
      }
    }
    if ((((int)local_78 == previous->r) && (local_78._4_4_ == previous->c)) &&
       ((pQStack_70 == (QModelIndex *)previous->i &&
        ((local_68 == (previous->m).ptr && ((this_00->columns).d.size != 0)))))) {
      uVar3 = 0;
      do {
        QAbstractItemView::rootIndex(&local_58,(QAbstractItemView *)(this_00->columns).d.ptr[uVar3])
        ;
        if ((int)local_78 == local_58.r) {
          if (((local_78._4_4_ == local_58.c) && (pQStack_70 == (QModelIndex *)local_58.i)) &&
             (local_68 == local_58.m.ptr)) {
            if ((ulong)(this_00->columns).d.size < (ulong)((int)uVar3 + 2)) {
              QColumnViewPrivate::createColumn(this_00,current,false);
            }
            goto LAB_0056db55;
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(this_00->columns).d.size);
    }
    QColumnViewPrivate::closeColumns(this_00,current,true);
LAB_0056db55:
    pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
    cVar1 = (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,current);
    if (cVar1 == '\0') {
      local_58.r = 0;
      local_58.c = 0;
      local_58.i = (quintptr)current;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
    }
LAB_0056db9b:
    QAbstractItemView::currentChanged((QAbstractItemView *)this,current,previous);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    Q_D(QColumnView);
    if (!current.isValid()) {
        QAbstractItemView::currentChanged(current, previous);
        return;
    }

    QModelIndex currentParent = current.parent();
    // optimize for just moving up/down in a list where the child view doesn't change
    if (currentParent == previous.parent()
            && model()->hasChildren(current) && model()->hasChildren(previous)) {
        for (int i = 0; i < d->columns.size(); ++i) {
            if (currentParent == d->columns.at(i)->rootIndex()) {
                if (d->columns.size() > i + 1) {
                    QAbstractItemView::currentChanged(current, previous);
                    return;
                }
                break;
            }
        }
    }

    // Scrolling to the right we need to have an empty spot
    bool found = false;
    if (currentParent == previous) {
        for (int i = 0; i < d->columns.size(); ++i) {
            if (currentParent == d->columns.at(i)->rootIndex()) {
                found = true;
                if (d->columns.size() < i + 2) {
                    d->createColumn(current, false);
                }
                break;
            }
        }
    }
    if (!found)
        d->closeColumns(current, true);

    if (!model()->hasChildren(current))
        emit updatePreviewWidget(current);

    QAbstractItemView::currentChanged(current, previous);
}